

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O0

void ffts1(float *ioptr,long M,long Rows,float *Utbl,short *BRLow)

{
  long NDiffU_00;
  float *in_RCX;
  long in_RDX;
  float *in_RSI;
  float *in_RDI;
  long in_R8;
  float *unaff_retaddr;
  long NDiffU;
  long StageCnt;
  long in_stack_00000068;
  long in_stack_00000070;
  long in_stack_00000078;
  float *in_stack_00000080;
  long in_stack_00000088;
  float *in_stack_00000090;
  long StageCnt_00;
  
  switch(in_RSI) {
  case (float *)0x0:
    break;
  case (float *)0x1:
    for (; 0 < in_RDX; in_RDX = in_RDX + -1) {
      fft2pt(in_RDI);
      in_RDI = in_RDI + (1L << ((byte)in_RSI & 0x3f)) * 2;
    }
    break;
  case (float *)0x2:
    for (; 0 < in_RDX; in_RDX = in_RDX + -1) {
      fft4pt(in_RDI);
      in_RDI = in_RDI + (1L << ((byte)in_RSI & 0x3f)) * 2;
    }
    break;
  case (float *)0x3:
    for (; 0 < in_RDX; in_RDX = in_RDX + -1) {
      fft8pt(in_RDI);
      in_RDI = in_RDI + (1L << ((byte)in_RSI & 0x3f)) * 2;
    }
    break;
  default:
    for (; 0 < in_RDX; in_RDX = in_RDX + -1) {
      bitrevR2(unaff_retaddr,(long)in_RDI,(short *)in_RSI);
      NDiffU_00 = ((long)in_RSI + -1) / 3;
      StageCnt_00 = 2;
      if ((long)in_RSI + NDiffU_00 * -3 + -1 == 1) {
        bfR2(in_RCX,in_R8,NDiffU_00);
        StageCnt_00 = StageCnt_00 << 1;
      }
      if ((long)in_RSI + NDiffU_00 * -3 + -1 == 2) {
        bfR4(in_RSI,in_RDX,(long)in_RCX);
        StageCnt_00 = StageCnt_00 << 2;
      }
      if (in_RSI < (float *)0xc) {
        bfstages(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
                 in_stack_00000070,in_stack_00000068);
      }
      else {
        fftrecurs(in_RSI,in_RDX,in_RCX,in_R8,NDiffU_00,StageCnt_00);
      }
      in_RDI = in_RDI + (1L << ((byte)in_RSI & 0x3f)) * 2;
    }
  }
  return;
}

Assistant:

void ffts1(float *ioptr, long M, long Rows, float *Utbl, short *BRLow){
/* Compute in-place complex fft on the rows of the input array	*/
/* INPUTS */
/* *ioptr = input data array	*/
/* M = log2 of fft size	(ex M=10 for 1024 point fft) */
/* Rows = number of rows in ioptr array (use Rows of 1 if ioptr is a 1 dimensional array)	*/
/* *Utbl = cosine table	*/
/* *BRLow = bit reversed counter table	*/
/* OUTPUTS */
/* *ioptr = output data array	*/

long 	StageCnt;
long 	NDiffU;

switch (M){
case 0:
	break;
case 1:
	for (;Rows>0;Rows--){
		fft2pt(ioptr);				/* a 2 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 2:
	for (;Rows>0;Rows--){
		fft4pt(ioptr);				/* a 4 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
case 3:
	for (;Rows>0;Rows--){
		fft8pt(ioptr);				/* an 8 pt fft */
		ioptr += 2*POW2(M);
	}
	break;
default:
	for (;Rows>0;Rows--){

		bitrevR2(ioptr, M, BRLow);						/* bit reverse and first radix 2 stage */
		
		StageCnt = (M-1) / 3;		// number of radix 8 stages
		NDiffU = 2;				// one radix 2 stage already complete

		if ( (M-1-(StageCnt * 3)) == 1 ){
			bfR2(ioptr, M, NDiffU);				/* 1 radix 2 stage */
			NDiffU *= 2;
		}

		if ( (M-1-(StageCnt * 3)) == 2 ){
			bfR4(ioptr, M, NDiffU);			/* 1 radix 4 stage */
			NDiffU *= 4;
		}

		if (M <= MCACHE)
			bfstages(ioptr, M, Utbl, 1, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/

		else{
			fftrecurs(ioptr, M, Utbl, 1, NDiffU, StageCnt);		/*  RADIX 8 Stages	*/
		}

		ioptr += 2*POW2(M);
	}
}
}